

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_ml_inline_table
          (serializer<toml::type_config> *this,table_type *t,table_format_info *fmt)

{
  bool bVar1;
  reference pvVar2;
  long in_RCX;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string_type *in_RDI;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  table_type *__range3;
  string_type *retval;
  value_type *in_stack_00000660;
  serializer<toml::type_config> *in_stack_00000668;
  undefined7 in_stack_fffffffffffffea8;
  char in_stack_fffffffffffffeaf;
  string_type *this_00;
  indent_char in_stack_ffffffffffffff27;
  serializer<toml::type_config> *in_stack_ffffffffffffff28;
  indent_char in_stack_ffffffffffffff4f;
  preserve_comments *in_stack_ffffffffffffff50;
  serializer<toml::type_config> *in_stack_ffffffffffffff58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_68;
  undefined8 local_60;
  undefined1 local_21;
  long local_20;
  undefined8 local_18;
  
  local_21 = 0;
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RSI);
  string_conv<std::__cxx11::string,3ul>
            ((char (*) [3])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  std::__cxx11::string::~string(this_00);
  *(int *)((long)&in_RSI->field_2 + 0xc) =
       *(int *)(local_20 + 4) + *(int *)((long)&in_RSI->field_2 + 0xc);
  local_60 = local_18;
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  while (bVar1 = std::__detail::operator==(&local_68,&local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x6bc022);
    (in_RSI->field_2)._M_local_buf[8] = '\x01';
    basic_value<toml::type_config>::comments(&pvVar2->second);
    format_comments_abi_cxx11_
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(this_00);
    format_indent_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff27);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(this_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(this_00);
    (in_RSI->field_2)._M_local_buf[8] = '\x01';
    operator()[abi_cxx11_(in_stack_00000668,in_stack_00000660);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(this_00);
    string_conv<std::__cxx11::string,3ul>
              ((char (*) [3])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(this_00);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                  *)this_00);
  }
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                   *)0x6bc297);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  *(int *)((long)&in_RSI->field_2 + 0xc) =
       *(int *)((long)&in_RSI->field_2 + 0xc) - *(int *)(local_20 + 4);
  (in_RSI->field_2)._M_local_buf[8] = '\0';
  *(int *)((long)&in_RSI->field_2 + 0xc) =
       *(int *)((long)&in_RSI->field_2 + 0xc) + *(int *)(local_20 + 0xc);
  format_indent_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff27);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  std::__cxx11::string::~string(this_00);
  *(int *)((long)&in_RSI->field_2 + 0xc) =
       *(int *)((long)&in_RSI->field_2 + 0xc) - *(int *)(local_20 + 0xc);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             in_stack_fffffffffffffeaf);
  return in_RDI;
}

Assistant:

string_type format_ml_inline_table(const table_type& t, const table_format_info& fmt) // {{{
    {
        string_type retval;
        retval += string_conv<string_type>("{\n");
        this->current_indent_ += fmt.body_indent;
        for(const auto& kv : t)
        {
            this->force_inline_ = true;
            retval += format_comments(kv.second.comments(), fmt.indent_type);
            retval += format_indent(fmt.indent_type);
            retval += kv.first;
            retval += string_conv<string_type>(" = ");

            this->force_inline_ = true;
            retval += (*this)(kv.second);

            retval += string_conv<string_type>(",\n");
        }
        if( ! t.empty())
        {
            retval.pop_back(); // '\n'
            retval.pop_back(); // ','
        }
        this->current_indent_ -= fmt.body_indent;
        this->force_inline_ = false;

        this->current_indent_ += fmt.closing_indent;
        retval += format_indent(fmt.indent_type);
        this->current_indent_ -= fmt.closing_indent;

        retval += char_type('}');
        return retval;
    }